

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

ssize_t __thiscall Database::write(Database *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  undefined4 in_register_00000034;
  IndexTree *this_00;
  undefined1 in_stack_0000000c [12];
  int new_slice_fd;
  uint16_t data_length;
  Database *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  this_00 = (IndexTree *)CONCAT44(in_register_00000034,__fd);
  pthread_rwlock_wrlock((pthread_rwlock_t *)this);
  sVar3 = polar_race::PolarString::size((PolarString *)__buf);
  if (0x2000000 < (uint)(ushort)sVar3 + (*(DatabaseMetadata **)((long)this + 0xc078))->currentOffset
     ) {
    createNewSlice(in_stack_00000050);
    mapSlice((Database *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)this >> 0x20),(int)this);
    *(char **)((long)this + 0xc068) =
         *(char **)((long)this +
                   (ulong)(*(DatabaseMetadata **)((long)this + 0xc078))->currentSliceNumber * 8 +
                   0x4068);
  }
  pcVar2 = *(char **)((long)this + 0xc068);
  uVar1 = (*(DatabaseMetadata **)((long)this + 0xc078))->currentOffset;
  __src = polar_race::PolarString::data((PolarString *)__buf);
  memcpy(pcVar2 + uVar1,__src,sVar3 & 0xffff);
  IndexTree::insert(this_00,(PolarString *)__buf,(IndexData)in_stack_0000000c);
  sVar3 = polar_race::PolarString::size((PolarString *)__buf);
  *(int *)(*(long *)((long)this + 0xc078) + 8) =
       *(int *)(*(long *)((long)this + 0xc078) + 8) + (int)sVar3;
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return 0;
}

Assistant:

RetCode Database::write(const PolarString &key, const PolarString &value) {
    pthread_rwlock_wrlock(&rwlock);
//    printf("DB Shard %d write %s with %s\n", id, key.data(), value.data());
    auto data_length = (uint16_t) value.size();
    if (__glibc_unlikely(data_length + metadata->currentOffset > SLICE_SIZE)) {
        // use a new slice
        auto new_slice_fd = createNewSlice();
        mapSlice(new_slice_fd, metadata->currentSliceNumber);
        currentSlice = slices[metadata->currentSliceNumber];
    }
    memcpy(currentSlice + metadata->currentOffset, value.data(), data_length);
    index->insert(key, {(int32_t) metadata->currentSliceNumber, metadata->currentOffset, data_length});
    metadata->currentOffset += value.size();
    pthread_rwlock_unlock(&rwlock);
    return polar_race::kSucc;
}